

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void av1_quantize_b_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  int iVar1;
  qm_val_t *qm_ptr;
  qm_val_t *iqm_ptr;
  _func_void_tran_low_t_ptr_intptr_t_int16_t_ptr_int16_t_ptr_int16_t_ptr_int16_t_ptr_tran_low_t_ptr_tran_low_t_ptr_int16_t_ptr_uint16_t_ptr_int16_t_ptr_int16_t_ptr
  **pp_Var2;
  
  qm_ptr = qparam->qmatrix;
  iqm_ptr = qparam->iqmatrix;
  if (qparam->use_quant_b_adapt == 0) {
    if (iqm_ptr != (qm_val_t *)0x0 && qm_ptr != (qm_val_t *)0x0) {
      aom_quantize_b_helper_c
                (coeff_ptr,n_coeffs,p->zbin_QTX,p->round_QTX,p->quant_QTX,p->quant_shift_QTX,
                 qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan,qm_ptr,iqm_ptr,
                 qparam->log_scale);
      return;
    }
    iVar1 = qparam->log_scale;
    if (iVar1 == 2) {
      pp_Var2 = &aom_quantize_b_64x64;
    }
    else if (iVar1 == 1) {
      pp_Var2 = &aom_quantize_b_32x32;
    }
    else {
      if (iVar1 != 0) {
        return;
      }
      pp_Var2 = &aom_quantize_b;
    }
  }
  else {
    if (iqm_ptr != (qm_val_t *)0x0 && qm_ptr != (qm_val_t *)0x0) {
      aom_quantize_b_adaptive_helper_c
                (coeff_ptr,n_coeffs,p->zbin_QTX,p->round_QTX,p->quant_QTX,p->quant_shift_QTX,
                 qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan,qm_ptr,iqm_ptr,
                 qparam->log_scale);
      return;
    }
    iVar1 = qparam->log_scale;
    if (iVar1 == 2) {
      aom_quantize_b_64x64_adaptive_sse2
                (coeff_ptr,n_coeffs,p->zbin_QTX,p->round_QTX,p->quant_QTX,p->quant_shift_QTX,
                 qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan);
      return;
    }
    if (iVar1 == 1) {
      aom_quantize_b_32x32_adaptive_sse2
                (coeff_ptr,n_coeffs,p->zbin_QTX,p->round_QTX,p->quant_QTX,p->quant_shift_QTX,
                 qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan);
      return;
    }
    if (iVar1 != 0) {
      return;
    }
    pp_Var2 = &aom_quantize_b_adaptive;
  }
  (**pp_Var2)(coeff_ptr,n_coeffs,p->zbin_QTX,p->round_QTX,p->quant_QTX,p->quant_shift_QTX,qcoeff_ptr
              ,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan);
  return;
}

Assistant:

void av1_quantize_b_facade(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                           const MACROBLOCK_PLANE *p, tran_low_t *qcoeff_ptr,
                           tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                           const SCAN_ORDER *sc, const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
#if !CONFIG_REALTIME_ONLY
  if (qparam->use_quant_b_adapt) {
    // TODO(sarahparker) These quantize_b optimizations need SIMD
    // implementations
    if (qm_ptr != NULL && iqm_ptr != NULL) {
      aom_quantize_b_adaptive_helper_c(
          coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
          p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX, eob_ptr,
          sc->scan, sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
    } else {
      switch (qparam->log_scale) {
        case 0:
          aom_quantize_b_adaptive(coeff_ptr, n_coeffs, p->zbin_QTX,
                                  p->round_QTX, p->quant_QTX,
                                  p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr,
                                  p->dequant_QTX, eob_ptr, sc->scan, sc->iscan);
          break;
        case 1:
          aom_quantize_b_32x32_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        case 2:
          aom_quantize_b_64x64_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        default: assert(0);
      }
    }
    return;
  }
#endif  // !CONFIG_REALTIME_ONLY

  if (qm_ptr != NULL && iqm_ptr != NULL) {
    aom_quantize_b_helper_c(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                            p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                            dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                            sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    switch (qparam->log_scale) {
      case 0:
        aom_quantize_b(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                       p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                       dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                       sc->iscan);
        break;
      case 1:
        aom_quantize_b_32x32(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                             p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                             dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                             sc->iscan);
        break;
      case 2:
        aom_quantize_b_64x64(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                             p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                             dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                             sc->iscan);
        break;
      default: assert(0);
    }
  }
}